

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall
AddrManImpl::AddSingle(AddrManImpl *this,CAddress *addr,CNetAddr *source,seconds time_penalty)

{
  string_view source_file;
  bool bVar1;
  strong_ordering sVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  AddrInfo *address;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *ptVar6;
  NetGroupManager *in_RDX;
  long in_RSI;
  CAddress *in_RDI;
  long in_FS_OFFSET;
  byte bVar7;
  int *unaff_retaddr;
  int *in_stack_00000008;
  AddrInfo *infoExisting;
  bool fInsert;
  int nFactor;
  bool currently_online;
  AddrInfo *pinfo;
  uint32_t mapped_as;
  int nUBucketPos;
  int nUBucket;
  hours update_interval;
  nid_type nId;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar8;
  int in_stack_fffffffffffffe3c;
  CNetAddr *in_stack_fffffffffffffe40;
  CNetAddr *in_stack_fffffffffffffe48;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe50;
  AddrManImpl *in_stack_fffffffffffffe58;
  AddrManImpl *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  allocator<char> *__a;
  duration in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe98;
  uint uVar9;
  undefined4 in_stack_fffffffffffffe9c;
  LogFlags in_stack_fffffffffffffea0;
  NetGroupManager *in_stack_fffffffffffffea8;
  CNetAddr *in_stack_fffffffffffffeb0;
  uint256 *in_stack_fffffffffffffeb8;
  NodeSeconds now;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined2 uVar10;
  ConstevalFormatString<4U> fmt;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  unkbyte9 in_stack_fffffffffffffef7;
  string_view in_stack_ffffffffffffff00;
  long local_58;
  Level in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (in_FS_OFFSET + 0x28);
  fmt.fmt = (char *)in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe3c,(AnnotatedMixin<std::mutex> *)0x87f371);
  bVar1 = CNetAddr::IsRoutable(in_stack_fffffffffffffe48);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_0087fb27;
  }
  address = Find(in_stack_fffffffffffffe60,(CService *)in_stack_fffffffffffffe58,
                 &in_stack_fffffffffffffe50->__r);
  bVar1 = ::operator==(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (bVar1) {
    s<(char)48>();
  }
  if (address == (AddrInfo *)0x0) {
    address = Create((AddrManImpl *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     in_RDI,(CNetAddr *)in_stack_fffffffffffffe88,
                     (nid_type *)in_stack_fffffffffffffe80.__r);
    s<(char)48>();
    std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
    time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),(duration *)0x87f6e2);
    std::chrono::operator-
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffe40,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    ptVar6 = std::
             max<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                       ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                        in_stack_fffffffffffffe48,
                        (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                        in_stack_fffffffffffffe40);
    (address->super_CAddress).nTime.__d.__r = (ptVar6->__d).__r;
  }
  else {
    NodeClock::now();
    std::chrono::operator-
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
               in_stack_fffffffffffffe40,
               (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    h<(char)50,(char)52>();
    sVar2 = std::chrono::
            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<3600L,_1L>_>
                      (in_stack_fffffffffffffe50,
                       (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffe48);
    iVar3 = (uint)(byte)sVar2._M_value << 0x10;
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (__unspec *)0x87f460);
    bVar1 = std::operator<((char)((uint)iVar3 >> 0x10));
    uVar10 = (undefined2)(CONCAT13(bVar1,(int3)iVar3) >> 0x10);
    if (bVar1) {
      h<(char)49>();
    }
    else {
      h<(char)50,(char)52>();
    }
    in_stack_fffffffffffffe88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(address->super_CAddress).nTime;
    std::chrono::operator-
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffe40,
               (duration<long,_std::ratio<3600L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::chrono::operator-
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_fffffffffffffe40,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    sVar2 = std::chrono::
            operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_fffffffffffffe40,
                       (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    iVar3 = (uint)CONCAT21(uVar10,sVar2._M_value) << 8;
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (__unspec *)0x87f515);
    bVar1 = std::operator<((char)((uint)iVar3 >> 8));
    if (bVar1) {
      s<(char)48>();
      std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::
      time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),(duration *)0x87f54a)
      ;
      std::chrono::operator-
                ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 in_stack_fffffffffffffe40,
                 (duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      ptVar6 = std::
               max<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                         ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                           *)in_stack_fffffffffffffe48,
                          (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                           *)in_stack_fffffffffffffe40);
      (address->super_CAddress).nTime.__d.__r = (ptVar6->__d).__r;
    }
    (address->super_CAddress).nServices =
         (address->super_CAddress).nServices | *(ServiceFlags *)(in_RSI + 0x30);
    sVar2 = std::chrono::
            operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_fffffffffffffe40,
                       (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffecc = CONCAT31((int3)((uint)iVar3 >> 8),sVar2._M_value);
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (__unspec *)0x87f5eb);
    bVar1 = std::operator<=((char)in_stack_fffffffffffffecc);
    if (bVar1) {
      bVar1 = false;
      goto LAB_0087fb27;
    }
    if ((address->fInTried & 1U) != 0) {
      bVar1 = false;
      goto LAB_0087fb27;
    }
    if (address->nRefCount == 8) {
      bVar1 = false;
      goto LAB_0087fb27;
    }
    if (0 < address->nRefCount) {
      in_stack_fffffffffffffec8 = 1 << ((byte)address->nRefCount & 0x1f);
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe60,
                         (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      if (iVar3 != 0) {
        bVar1 = false;
        goto LAB_0087fb27;
      }
    }
  }
  iVar3 = AddrInfo::GetNewBucket
                    ((AddrInfo *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  iVar4 = AddrInfo::GetBucketPosition
                    ((AddrInfo *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (uint256 *)in_RDI,SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  bVar7 = *(long *)((long)in_RDI + (long)iVar4 * 8 + (long)iVar3 * 0x200 + 0x20180) == -1;
  if (*(long *)((long)in_RDI + (long)iVar4 * 8 + (long)iVar3 * 0x200 + 0x20180) != local_58) {
    if (!(bool)bVar7) {
      in_stack_fffffffffffffe80.__r =
           (rep)std::
                unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                              *)in_stack_fffffffffffffe48,(key_type *)in_stack_fffffffffffffe40);
      now.__d.__r = (duration)(duration)in_stack_fffffffffffffe80.__r;
      Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
      bVar1 = AddrInfo::IsTerrible((AddrInfo *)in_stack_fffffffffffffe58,now);
      if ((bVar1) || ((1 < *(int *)((long)now.__d.__r + 0x74) && (address->nRefCount == 0)))) {
        bVar7 = 1;
      }
    }
    if ((bVar7 & 1) == 0) {
      if (address->nRefCount == 0) {
        Delete(in_stack_fffffffffffffe58,(nid_type)in_stack_fffffffffffffe68);
      }
    }
    else {
      ClearNew((AddrManImpl *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      address->nRefCount = address->nRefCount + 1;
      *(long *)((long)in_RDI + (long)iVar4 * 8 + (long)iVar3 * 0x200 + 0x20180) = local_58;
      uVar5 = NetGroupManager::GetMappedAS(in_RDX,(CNetAddr *)address);
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
                   (char *)in_stack_fffffffffffffe50);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
                   (char *)in_stack_fffffffffffffe50);
        iVar3 = 0;
        CService::ToStringAddrPort_abi_cxx11_
                  ((CService *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        uVar9 = 0;
        if (uVar5 == 0) {
          __a = (allocator<char> *)&stack0xfffffffffffffef7;
          std::allocator<char>::allocator();
          uVar9 = 0x1000000;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80.__r,__a);
        }
        else {
          tinyformat::format<unsigned_int>
                    (in_stack_fffffffffffffe68,(uint *)in_stack_fffffffffffffe60);
        }
        uVar8 = 1;
        source_file._M_len._6_1_ = in_stack_fffffffffffffef6;
        source_file._M_len._0_6_ = in_stack_fffffffffffffef0;
        source_file._7_9_ = in_stack_fffffffffffffef7;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
                  (in_stack_ffffffffffffff00,source_file,iVar3,in_stack_fffffffffffffea0,
                   in_stack_ffffffffffffffe0,fmt,in_stack_fffffffffffffff0,args_1,unaff_retaddr,
                   in_stack_00000008);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe3c,uVar8));
        if ((uVar9 & 0x1000000) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe3c,uVar8));
      }
    }
  }
  bVar1 = (bool)(bVar7 & 1);
LAB_0087fb27:
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      != args_1) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool AddrManImpl::AddSingle(const CAddress& addr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    AssertLockHeld(cs);

    if (!addr.IsRoutable())
        return false;

    nid_type nId;
    AddrInfo* pinfo = Find(addr, &nId);

    // Do not set a penalty for a source's self-announcement
    if (addr == source) {
        time_penalty = 0s;
    }

    if (pinfo) {
        // periodically update nTime
        const bool currently_online{NodeClock::now() - addr.nTime < 24h};
        const auto update_interval{currently_online ? 1h : 24h};
        if (pinfo->nTime < addr.nTime - update_interval - time_penalty) {
            pinfo->nTime = std::max(NodeSeconds{0s}, addr.nTime - time_penalty);
        }

        // add services
        pinfo->nServices = ServiceFlags(pinfo->nServices | addr.nServices);

        // do not update if no new information is present
        if (addr.nTime <= pinfo->nTime) {
            return false;
        }

        // do not update if the entry was already in the "tried" table
        if (pinfo->fInTried)
            return false;

        // do not update if the max reference count is reached
        if (pinfo->nRefCount == ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
            return false;

        // stochastic test: previous nRefCount == N: 2^N times harder to increase it
        if (pinfo->nRefCount > 0) {
            const int nFactor{1 << pinfo->nRefCount};
            if (insecure_rand.randrange(nFactor) != 0) return false;
        }
    } else {
        pinfo = Create(addr, source, &nId);
        pinfo->nTime = std::max(NodeSeconds{0s}, pinfo->nTime - time_penalty);
    }

    int nUBucket = pinfo->GetNewBucket(nKey, source, m_netgroupman);
    int nUBucketPos = pinfo->GetBucketPosition(nKey, true, nUBucket);
    bool fInsert = vvNew[nUBucket][nUBucketPos] == -1;
    if (vvNew[nUBucket][nUBucketPos] != nId) {
        if (!fInsert) {
            AddrInfo& infoExisting = mapInfo[vvNew[nUBucket][nUBucketPos]];
            if (infoExisting.IsTerrible() || (infoExisting.nRefCount > 1 && pinfo->nRefCount == 0)) {
                // Overwrite the existing new table entry.
                fInsert = true;
            }
        }
        if (fInsert) {
            ClearNew(nUBucket, nUBucketPos);
            pinfo->nRefCount++;
            vvNew[nUBucket][nUBucketPos] = nId;
            const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
            LogDebug(BCLog::ADDRMAN, "Added %s%s to new[%i][%i]\n",
                     addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), nUBucket, nUBucketPos);
        } else {
            if (pinfo->nRefCount == 0) {
                Delete(nId);
            }
        }
    }
    return fInsert;
}